

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consumer.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int fd_00;
  Message *this;
  char *pcVar1;
  char *message;
  int count;
  Message *msg;
  int fd;
  int openFlags;
  mode_t mode;
  char *sharedFileName;
  char **argv_local;
  int argc_local;
  
  fd_00 = open("shared.dat",2,0x1b6);
  if (fd_00 == -1) {
    printf("open returned (-1)\n");
    return -1;
  }
  this = Message::GetFromMemoryMappedFile(fd_00);
  message._4_4_ = 0;
  do {
    pcVar1 = Message::DequeueMessage(this);
    message._4_4_ = message._4_4_ + 1;
    printf("%d: %s",(ulong)message._4_4_,pcVar1);
    fflush(_stdout);
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{

    const char *sharedFileName = "shared.dat";
    const mode_t mode = 0666;
    const int openFlags = (O_RDWR);
    int fd = open(sharedFileName, openFlags, mode);

    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    Message* msg = Message::GetFromMemoryMappedFile(fd);

    int count = 0;

    while(1)
    {
        char *message = msg->DequeueMessage();
        printf("%d: %s", ++count, message);
        fflush(stdout);
    }

    Message::ReleaseFile(msg, fd);

    close(fd);
}